

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_jh.c
# Opt level: O2

void F8(hashState *state)

{
  uint64 *puVar1;
  undefined4 uVar2;
  uint64 uVar3;
  ulong uVar4;
  ulong uVar5;
  uint64 (*pauVar6) [2];
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  
  for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
    puVar1 = state->x[0] + (uVar4 & 0xfffffffffffffffe) + (ulong)((uint)uVar4 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar4 * 8);
  }
  local_58 = 0x197d40;
  local_60 = 0x197cc0;
  local_68 = 0x197ce0;
  local_70 = 0x197d00;
  local_78 = 0x197d20;
  local_80 = 0x197d60;
  local_88 = 0x197d80;
  for (uVar4 = 0; uVar4 < 0x2a; uVar4 = uVar4 + 7) {
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar12 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_60 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_60 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar10 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar10 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar10 = uVar13 & uVar12 ^ uVar10;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar16 = uVar10 & uVar13 ^ uVar17;
      uVar12 = uVar12 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar10 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar10 = (uVar12 | uVar16) ^ uVar10;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar10;
      uVar17 = uVar16 ^ uVar15 ^ uVar10 & uVar14;
      uVar10 = uVar13 & uVar16 ^ uVar12 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar17;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar10 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar5 ^ uVar9;
      state->x[2][lVar11] = uVar9 >> 1 & 0x5555555555555555 | uVar9 * 2 & 0xaaaaaaaaaaaaaaaa;
      state->x[4][lVar11] = uVar17 >> 1 & 0x5555555555555555 | uVar17 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) =
           uVar14 >> 1 & 0x5555555555555555 | uVar14 * 2 & 0xaaaaaaaaaaaaaaaa;
      *(ulong *)(state->buffer + lVar11 * 8) =
           uVar10 >> 1 & 0x5555555555555555 | uVar10 * 2 & 0xaaaaaaaaaaaaaaaa;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar12 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_68 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_68 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar10 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar10 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar10 = uVar13 & uVar12 ^ uVar10;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar16 = uVar10 & uVar13 ^ uVar17;
      uVar12 = uVar12 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar10 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar10 = (uVar12 | uVar16) ^ uVar10;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar10;
      uVar17 = uVar16 ^ uVar15 ^ uVar10 & uVar14;
      uVar10 = uVar13 & uVar16 ^ uVar12 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar17;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar10 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar5 ^ uVar9;
      state->x[2][lVar11] = uVar9 >> 2 & 0x3333333333333333 | uVar9 * 4 & 0xcccccccccccccccc;
      state->x[4][lVar11] = uVar17 >> 2 & 0x3333333333333333 | uVar17 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) =
           uVar14 >> 2 & 0x3333333333333333 | uVar14 * 4 & 0xcccccccccccccccc;
      *(ulong *)(state->buffer + lVar11 * 8) =
           uVar10 >> 2 & 0x3333333333333333 | uVar10 * 4 & 0xcccccccccccccccc;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar12 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_70 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_70 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar10 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar10 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar10 = uVar13 & uVar12 ^ uVar10;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar16 = uVar10 & uVar13 ^ uVar17;
      uVar12 = uVar12 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar10 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar10 = (uVar12 | uVar16) ^ uVar10;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar10;
      uVar17 = uVar16 ^ uVar15 ^ uVar10 & uVar14;
      uVar10 = uVar13 & uVar16 ^ uVar12 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar17;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar10 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar5 ^ uVar9;
      state->x[2][lVar11] = uVar9 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar9 & 0xf0f0f0f0f0f0f0f) << 4;
      state->x[4][lVar11] = uVar17 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar17 & 0xf0f0f0f0f0f0f0f) << 4;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) =
           uVar14 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar14 & 0xf0f0f0f0f0f0f0f) << 4;
      *(ulong *)(state->buffer + lVar11 * 8) =
           uVar10 >> 4 & 0xf0f0f0f0f0f0f0f | (uVar10 & 0xf0f0f0f0f0f0f0f) << 4;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar12 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_78 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_78 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar10 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar10 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar10 = uVar13 & uVar12 ^ uVar10;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar16 = uVar10 & uVar13 ^ uVar17;
      uVar12 = uVar12 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar10 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar10 = (uVar12 | uVar16) ^ uVar10;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar10;
      uVar17 = uVar16 ^ uVar15 ^ uVar10 & uVar14;
      uVar10 = uVar13 & uVar16 ^ uVar12 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar17;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar10 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar5 ^ uVar9;
      state->x[2][lVar11] = uVar9 >> 8 & 0xff00ff00ff00ff | (uVar9 & 0xff00ff00ff00ff) << 8;
      state->x[4][lVar11] = uVar17 >> 8 & 0xff00ff00ff00ff | (uVar17 & 0xff00ff00ff00ff) << 8;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) =
           uVar14 >> 8 & 0xff00ff00ff00ff | (uVar14 & 0xff00ff00ff00ff) << 8;
      *(ulong *)(state->buffer + lVar11 * 8) =
           uVar10 >> 8 & 0xff00ff00ff00ff | (uVar10 & 0xff00ff00ff00ff) << 8;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar12 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_58 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_58 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar10 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar10 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar10 = uVar13 & uVar12 ^ uVar10;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar16 = uVar10 & uVar13 ^ uVar17;
      uVar12 = uVar12 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar10 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar10 = (uVar12 | uVar16) ^ uVar10;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar10;
      uVar17 = uVar16 ^ uVar15 ^ uVar10 & uVar14;
      uVar10 = uVar13 & uVar16 ^ uVar12 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar17;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar10 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar5 ^ uVar9;
      state->x[2][lVar11] = uVar9 >> 0x10 & 0xffff0000ffff | (uVar9 & 0xffff0000ffff) << 0x10;
      state->x[4][lVar11] = uVar17 >> 0x10 & 0xffff0000ffff | (uVar17 & 0xffff0000ffff) << 0x10;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) =
           uVar14 >> 0x10 & 0xffff0000ffff | (uVar14 & 0xffff0000ffff) << 0x10;
      *(ulong *)(state->buffer + lVar11 * 8) =
           uVar10 >> 0x10 & 0xffff0000ffff | (uVar10 & 0xffff0000ffff) << 0x10;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar10 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar16 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_80 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_80 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar12 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar12 ^ uVar14;
      uVar7 = uVar15 & uVar10 ^ uVar7;
      uVar12 = uVar13 & uVar16 ^ uVar12;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar10 = uVar10 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar18 = uVar12 & uVar13 ^ uVar17;
      uVar16 = uVar16 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar12 ^ uVar13;
      uVar17 = uVar15 & uVar8 ^ uVar10;
      uVar7 = (uVar10 | uVar8) ^ uVar7;
      uVar12 = (uVar16 | uVar18) ^ uVar12;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar5 = uVar8 ^ uVar12;
      uVar10 = uVar18 ^ uVar15 ^ uVar12 & uVar14;
      uVar9 = uVar13 & uVar18 ^ uVar16 ^ uVar7;
      state->x[1][lVar11] = uVar7 ^ uVar10;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar17;
      state->x[3][lVar11] = uVar8 ^ uVar14;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar15 ^ uVar9 ^ uVar5;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar17 ^ uVar5;
      state->x[2][lVar11] = uVar5 << 0x20 | uVar5 >> 0x20;
      state->x[4][lVar11] = uVar10 << 0x20 | uVar10 >> 0x20;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) = uVar14 << 0x20 | uVar14 >> 0x20;
      *(ulong *)(state->buffer + lVar11 * 8) = uVar9 << 0x20 | uVar9 >> 0x20;
    }
    for (lVar11 = -2; lVar11 != 0; lVar11 = lVar11 + 1) {
      uVar18 = ~*(ulong *)(state->buffer + lVar11 * 8 + -0x10);
      uVar16 = ~*(ulong *)(state->buffer + lVar11 * 8);
      uVar15 = *(ulong *)(state->buffer + lVar11 * 8 + -0x30);
      uVar9 = *(ulong *)(local_88 + lVar11 * 8);
      uVar7 = ~uVar15 & uVar9 ^ state->x[1][lVar11];
      uVar14 = *(ulong *)(local_88 + 0x10 + lVar11 * 8);
      uVar13 = *(ulong *)(state->buffer + lVar11 * 8 + -0x20);
      uVar12 = ~uVar13 & uVar14 ^ state->x[2][lVar11];
      uVar5 = state->x[3][lVar11];
      uVar17 = state->x[4][lVar11];
      uVar9 = uVar5 & uVar7 ^ uVar9;
      uVar14 = uVar17 & uVar12 ^ uVar14;
      uVar7 = uVar15 & uVar18 ^ uVar7;
      uVar12 = uVar13 & uVar16 ^ uVar12;
      uVar8 = uVar7 & uVar15 ^ uVar5;
      uVar18 = uVar18 ^ ~uVar5 & uVar15;
      uVar15 = (~uVar5 & uVar15 ^ *(ulong *)(state->buffer + lVar11 * 8 + -0x10)) & uVar7 ^ uVar15;
      uVar10 = uVar12 & uVar13 ^ uVar17;
      uVar16 = uVar16 ^ ~uVar17 & uVar13;
      uVar13 = (~uVar17 & uVar13 ^ *(ulong *)(state->buffer + lVar11 * 8)) & uVar12 ^ uVar13;
      uVar5 = uVar15 & uVar8 ^ uVar18;
      uVar7 = (uVar18 | uVar8) ^ uVar7;
      uVar12 = (uVar16 | uVar10) ^ uVar12;
      uVar8 = uVar7 & uVar9 ^ uVar8;
      uVar15 = uVar15 ^ uVar9;
      uVar9 = uVar8 ^ uVar12;
      uVar12 = uVar10 ^ uVar15 ^ uVar12 & uVar14;
      state->x[2][lVar11] = uVar9;
      state->x[4][lVar11] = uVar12;
      uVar17 = uVar13 & uVar10 ^ uVar16 ^ uVar7;
      uVar14 = uVar13 ^ uVar14 ^ uVar7 ^ uVar5;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x20) = uVar14;
      *(ulong *)(state->buffer + lVar11 * 8) = uVar17;
      state->x[1][lVar11] = uVar12 ^ uVar7;
      state->x[3][lVar11] = uVar14 ^ uVar8;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x30) = uVar17 ^ uVar15 ^ uVar9;
      *(ulong *)(state->buffer + lVar11 * 8 + -0x10) = uVar9 ^ uVar5;
    }
    pauVar6 = state->x + 1;
    for (uVar15 = 1; uVar15 < 8; uVar15 = uVar15 + 2) {
      uVar3 = (*pauVar6)[0];
      uVar2 = *(undefined4 *)((long)*pauVar6 + 4);
      *(int *)*pauVar6 = (int)(*pauVar6)[1];
      *(undefined4 *)((long)*pauVar6 + 4) = uVar2;
      *(int *)(*pauVar6 + 1) = (int)uVar3;
      *(undefined4 *)((long)*pauVar6 + 0xc) = uVar2;
      pauVar6 = pauVar6 + 2;
    }
    local_60 = local_60 + 0xe0;
    local_68 = local_68 + 0xe0;
    local_70 = local_70 + 0xe0;
    local_78 = local_78 + 0xe0;
    local_58 = local_58 + 0xe0;
    local_80 = local_80 + 0xe0;
    local_88 = local_88 + 0xe0;
  }
  for (uVar4 = 0; uVar4 != 8; uVar4 = uVar4 + 1) {
    puVar1 = state->x[4] + (uVar4 & 0xfffffffffffffffe) + (ulong)((uint)uVar4 & 1);
    *puVar1 = *puVar1 ^ *(ulong *)(state->buffer + uVar4 * 8);
  }
  return;
}

Assistant:

static void F8(hashState *state)
{
      uint64  i;

      /*xor the 512-bit message with the fist half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[i >> 1][i & 1] ^= ((uint64*)state->buffer)[i];

      /*the bijective function E8 */
      E8(state);

      /*xor the 512-bit message with the second half of the 1024-bit hash state*/
      for (i = 0; i < 8; i++)  state->x[(8+i) >> 1][(8+i) & 1] ^= ((uint64*)state->buffer)[i];
}